

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::TransactionInfo::Deserialize(TransactionInfo *this,Deserializer *deserializer)

{
  TransactionType TVar1;
  TransactionModifierType TVar2;
  int iVar3;
  TransactionInfo *this_00;
  pointer pTVar4;
  pointer *__ptr;
  string str;
  _Head_base<0UL,_duckdb::TransactionInfo_*,_false> local_48;
  char *local_40 [2];
  char local_30 [16];
  
  this_00 = (TransactionInfo *)operator_new(0x10);
  TransactionInfo(this_00);
  local_48._M_head_impl = this_00;
  pTVar4 = unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>::
           operator->((unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>
                       *)&local_48);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_40,deserializer);
    TVar1 = EnumUtil::FromString<duckdb::TransactionType>(local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    TVar1 = (TransactionType)iVar3;
  }
  (pTVar4->super_ParseInfo).field_0x9 = TVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pTVar4 = unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>::
           operator->((unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>
                       *)&local_48);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"modifier");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_40,deserializer);
    TVar2 = EnumUtil::FromString<duckdb::TransactionModifierType>(local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    TVar2 = (TransactionModifierType)iVar3;
  }
  (pTVar4->super_ParseInfo).field_0xa = TVar2;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_48._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> TransactionInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<TransactionInfo>(new TransactionInfo());
	deserializer.ReadProperty<TransactionType>(200, "type", result->type);
	deserializer.ReadProperty<TransactionModifierType>(201, "modifier", result->modifier);
	return std::move(result);
}